

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawListSplitter::Split(ImDrawListSplitter *this,ImDrawList *draw_list,int channels_count)

{
  undefined8 *puVar1;
  int iVar2;
  ImDrawChannel *pIVar3;
  void *pvVar4;
  ImDrawChannel *pIVar5;
  void *pvVar6;
  long lVar7;
  ulong uVar8;
  
  iVar2 = (this->_Channels).Size;
  if (iVar2 < channels_count) {
    if ((this->_Channels).Capacity < channels_count) {
      pIVar5 = (ImDrawChannel *)ImGui::MemAlloc((long)channels_count << 5);
      pIVar3 = (this->_Channels).Data;
      if (pIVar3 != (ImDrawChannel *)0x0) {
        memcpy(pIVar5,pIVar3,(long)(this->_Channels).Size << 5);
        ImGui::MemFree((this->_Channels).Data);
      }
      (this->_Channels).Data = pIVar5;
      (this->_Channels).Capacity = channels_count;
    }
    (this->_Channels).Size = channels_count;
  }
  this->_Count = channels_count;
  pIVar3 = (this->_Channels).Data;
  (pIVar3->_IdxBuffer).Size = 0;
  (pIVar3->_IdxBuffer).Capacity = 0;
  (pIVar3->_IdxBuffer).Data = (uint *)0x0;
  (pIVar3->_CmdBuffer).Size = 0;
  (pIVar3->_CmdBuffer).Capacity = 0;
  (pIVar3->_CmdBuffer).Data = (ImDrawCmd *)0x0;
  if (1 < channels_count) {
    uVar8 = 1;
    lVar7 = 0x38;
    do {
      pIVar3 = (this->_Channels).Data;
      if ((long)uVar8 < (long)iVar2) {
        pIVar5 = pIVar3;
        if (*(int *)((long)pIVar3 + lVar7 + -0x14) < 0) {
          pvVar6 = ImGui::MemAlloc(0);
          pvVar4 = *(void **)((long)pIVar3 + lVar7 + -0x10);
          if (pvVar4 != (void *)0x0) {
            memcpy(pvVar6,pvVar4,(long)*(int *)((long)pIVar3 + lVar7 + -0x18) * 0x38);
            ImGui::MemFree(*(void **)((long)pIVar3 + lVar7 + -0x10));
          }
          *(void **)((long)pIVar3 + lVar7 + -0x10) = pvVar6;
          *(undefined4 *)((long)pIVar3 + lVar7 + -0x14) = 0;
          pIVar5 = (this->_Channels).Data;
        }
        *(undefined4 *)((long)pIVar3 + lVar7 + -0x18) = 0;
        if (*(int *)((long)pIVar5 + lVar7 + -4) < 0) {
          pvVar6 = ImGui::MemAlloc(0);
          pvVar4 = *(void **)((long)&(pIVar5->_CmdBuffer).Size + lVar7);
          if (pvVar4 != (void *)0x0) {
            memcpy(pvVar6,pvVar4,(long)*(int *)((long)pIVar5 + lVar7 + -8) << 2);
            ImGui::MemFree(*(void **)((long)&(pIVar5->_CmdBuffer).Size + lVar7));
          }
          *(void **)((long)&(pIVar5->_CmdBuffer).Size + lVar7) = pvVar6;
          *(undefined4 *)((long)pIVar5 + lVar7 + -4) = 0;
        }
        *(undefined4 *)((long)pIVar5 + lVar7 + -8) = 0;
      }
      else {
        puVar1 = (undefined8 *)((long)&(pIVar3->_CmdBuffer).Size + lVar7);
        puVar1[-1] = 0;
        *puVar1 = 0;
        puVar1[-3] = 0;
        puVar1[-2] = 0;
      }
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x20;
    } while ((uint)channels_count != uVar8);
  }
  return;
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_UNUSED(draw_list);
    IM_ASSERT(_Current == 0 && _Count <= 1 && "Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.");
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
    {
        _Channels.reserve(channels_count); // Avoid over reserving since this is likely to stay stable
        _Channels.resize(channels_count);
    }
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
    }
}